

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O1

bool __thiscall libwebm::VpxPesParser::VerifyPacketStartCode(VpxPesParser *this)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)(this + 0x70);
  lVar2 = *(long *)(this + 0x58);
  if (((lVar1 + 2U <= (ulong)(*(long *)(this + 0x60) - lVar2)) && (*(char *)(lVar2 + lVar1) == '\0')
      ) && (*(char *)(lVar2 + 1 + lVar1) == '\0')) {
    return *(char *)(lVar2 + lVar1 + 2U) == '\x01';
  }
  return false;
}

Assistant:

bool VpxPesParser::VerifyPacketStartCode() const {
  if (read_pos_ + 2 > pes_file_data_.size())
    return false;

  // PES packets all start with the byte sequence 0x0 0x0 0x1.
  if (pes_file_data_[read_pos_] != 0 || pes_file_data_[read_pos_ + 1] != 0 ||
      pes_file_data_[read_pos_ + 2] != 1) {
    return false;
  }

  return true;
}